

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_group_norm_inplace(ggml_context *ctx,ggml_tensor *a,int n_groups,float eps)

{
  ggml_tensor *pgVar1;
  
  pgVar1 = ggml_view_tensor(ctx,a);
  pgVar1->op_params[0] = n_groups;
  pgVar1->op_params[1] = (int32_t)eps;
  pgVar1->op = GGML_OP_GROUP_NORM;
  pgVar1->src[0] = a;
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_group_norm_inplace(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   n_groups,
        float                 eps) {
    return ggml_group_norm_impl(ctx, a, n_groups, eps, true);
}